

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void collectvalidlines(lua_State *L,Closure *f)

{
  int *piVar1;
  StkId pTVar2;
  Table *t_00;
  TValue *io_1;
  Table *x_;
  TValue *io;
  Table *t;
  int *lineinfo;
  TValue v;
  int i;
  Closure *f_local;
  lua_State *L_local;
  
  if ((f == (Closure *)0x0) || ((f->c).tt == '&')) {
    L->top->tt_ = 0;
    L->top = L->top + 1;
  }
  else {
    piVar1 = ((f->l).p)->lineinfo;
    t_00 = luaH_new(L);
    pTVar2 = L->top;
    (pTVar2->value_).gc = (GCObject *)t_00;
    pTVar2->tt_ = 0x45;
    L->top = L->top + 1;
    lineinfo._0_4_ = 1;
    v.value_.b = 1;
    for (v._12_4_ = 0; (int)v._12_4_ < ((f->l).p)->sizelineinfo; v._12_4_ = v._12_4_ + 1) {
      luaH_setint(L,t_00,(long)piVar1[(int)v._12_4_],(TValue *)&lineinfo);
    }
  }
  return;
}

Assistant:

static void collectvalidlines(lua_State *L, Closure *f) {
    if (noLuaClosure(f)) {
        setnilvalue(L->top);
        api_incr_top(L);
    } else {
        int i;
        TValue v;
        int *lineinfo = f->l.p->lineinfo;
        Table *t = luaH_new(L);  /* new table to store active lines */
        sethvalue(L, L->top, t);  /* push it on stack */
        api_incr_top(L);
        setbvalue(&v, 1);  /* boolean 'true' to be the value of all indices */
        for (i = 0; i < f->l.p->sizelineinfo; i++)  /* for all lines with code */
            luaH_setint(L, t, lineinfo[i], &v);  /* table[line] = true */
    }
}